

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O1

Mfs_Man_t * Mfs_ManAlloc(Mfs_Par_t *pPars)

{
  ulong uVar1;
  uint uVar2;
  Mfs_Man_t *__s;
  Vec_Int_t *pVVar3;
  int *piVar4;
  void **ppvVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Int_Man_t *pIVar8;
  Vec_Vec_t *pVVar9;
  undefined8 *puVar10;
  int iVar11;
  ulong uVar12;
  void **ppvVar13;
  long lVar14;
  
  __s = (Mfs_Man_t *)malloc(0x388);
  memset(__s,0,0x388);
  __s->pPars = pPars;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  __s->vProjVarsCnf = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  __s->vProjVarsSat = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  __s->vDivLits = pVVar3;
  lVar14 = (long)pPars->nWinMax;
  uVar2 = pPars->nWinMax + 0xc;
  iVar11 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  __s->nDivWords = iVar11;
  uVar1 = lVar14 + 0xd;
  ppvVar5 = (void **)malloc(((long)iVar11 * 4 + 8) * uVar1);
  if (-0xd < lVar14) {
    ppvVar6 = ppvVar5 + lVar14 + 0xd;
    uVar12 = uVar1 & 0xffffffff;
    ppvVar13 = ppvVar5;
    do {
      *ppvVar13 = ppvVar6;
      ppvVar13 = ppvVar13 + 1;
      ppvVar6 = (void **)((long)ppvVar6 + (long)iVar11 * 4);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nSize = (int)uVar1;
  pVVar7->nCap = (int)uVar1;
  pVVar7->pArray = ppvVar5;
  __s->vDivCexes = pVVar7;
  lVar14 = 0;
  pIVar8 = Int_ManAlloc();
  __s->pMan = pIVar8;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (int *)0x0;
  __s->vMem = pVVar3;
  pVVar9 = (Vec_Vec_t *)malloc(0x10);
  pVVar9->nCap = 0x20;
  pVVar9->nSize = 0;
  ppvVar5 = (void **)malloc(0x100);
  pVVar9->pArray = ppvVar5;
  do {
    puVar10 = (undefined8 *)malloc(0x10);
    *puVar10 = 0;
    puVar10[1] = 0;
    ppvVar5[lVar14] = puVar10;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x20);
  pVVar9->nSize = 0x20;
  __s->vLevels = pVVar9;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x20;
  pVVar7->nSize = 0;
  ppvVar5 = (void **)malloc(0x100);
  pVVar7->pArray = ppvVar5;
  __s->vMfsFanins = pVVar7;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mfs_Man_t * Mfs_ManAlloc( Mfs_Par_t * pPars )
{
    Mfs_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Mfs_Man_t, 1 );
    memset( p, 0, sizeof(Mfs_Man_t) );
    p->pPars     = pPars;
    p->vProjVarsCnf = Vec_IntAlloc( 100 );
    p->vProjVarsSat = Vec_IntAlloc( 100 );
    p->vDivLits  = Vec_IntAlloc( 100 );
    p->nDivWords = Abc_BitWordNum(p->pPars->nWinMax + MFS_FANIN_MAX);
    p->vDivCexes = Vec_PtrAllocSimInfo( p->pPars->nWinMax + MFS_FANIN_MAX + 1, p->nDivWords );
    p->pMan      = Int_ManAlloc();
    p->vMem      = Vec_IntAlloc( 0 );
    p->vLevels   = Vec_VecStart( 32 );
    p->vMfsFanins= Vec_PtrAlloc( 32 );
    return p;
}